

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

void __thiscall cmState::AddBuiltinCommand(cmState *this,string *name,BuiltinCommand command)

{
  anon_class_8_1_bc00122b local_48;
  Command local_40;
  BuiltinCommand local_20;
  BuiltinCommand command_local;
  string *name_local;
  cmState *this_local;
  
  local_48.command = command;
  local_20 = command;
  command_local = (BuiltinCommand)name;
  name_local = (string *)this;
  std::
  function<bool(std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>const&,cmExecutionStatus&)>
  ::
  function<cmState::AddBuiltinCommand(std::__cxx11::string_const&,bool(*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&))::__0,void>
            ((function<bool(std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>const&,cmExecutionStatus&)>
              *)&local_40,&local_48);
  AddBuiltinCommand(this,name,&local_40);
  std::
  function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
  ::~function(&local_40);
  return;
}

Assistant:

void cmState::AddBuiltinCommand(std::string const& name,
                                BuiltinCommand command)
{
  this->AddBuiltinCommand(
    name,
    [command](const std::vector<cmListFileArgument>& args,
              cmExecutionStatus& status) -> bool {
      return InvokeBuiltinCommand(command, args, status);
    });
}